

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void capnp::compiler::findImports
               (Reader decl,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  undefined8 uVar1;
  Reader exp;
  Reader decl_00;
  Reader exp_00;
  Reader paramList;
  Reader paramList_00;
  uint uVar2;
  StructReader *__return_storage_ptr__;
  Reader method;
  Reader superclass;
  IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
  local_1c8;
  Reader local_1b8;
  Reader local_188;
  Reader local_150;
  Reader local_120;
  Reader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  if (decl._reader.dataSize < 0x20) goto switchD_001175f1_caseD_3;
  uVar1 = decl._reader._32_8_;
  switch(*(undefined2 *)((long)decl._reader.data + 2)) {
  case 1:
    local_1b8._reader.nestingLimit = decl._reader.nestingLimit;
    local_1b8._reader._44_4_ = decl._reader._44_4_;
    local_1b8._reader.data = decl._reader.data;
    local_1b8._reader.pointers = decl._reader.pointers;
    local_1b8._reader.segment = decl._reader.segment;
    local_1b8._reader.capTable = decl._reader.capTable;
    __return_storage_ptr__ = &local_60;
    local_1b8._reader._32_8_ = uVar1;
    Declaration::Using::Reader::getTarget((Reader *)__return_storage_ptr__,&local_1b8);
    break;
  case 2:
    local_1b8._reader.nestingLimit = decl._reader.nestingLimit;
    local_1b8._reader._44_4_ = decl._reader._44_4_;
    local_1b8._reader.data = decl._reader.data;
    local_1b8._reader.pointers = decl._reader.pointers;
    local_1b8._reader.segment = decl._reader.segment;
    local_1b8._reader.capTable = decl._reader.capTable;
    __return_storage_ptr__ = &local_90;
    local_1b8._reader._32_8_ = uVar1;
    Declaration::Const::Reader::getType((Reader *)__return_storage_ptr__,(Reader *)&local_1b8);
    break;
  default:
    goto switchD_001175f1_caseD_3;
  case 6:
    local_1b8._reader.nestingLimit = decl._reader.nestingLimit;
    local_1b8._reader._44_4_ = decl._reader._44_4_;
    local_1b8._reader.data = decl._reader.data;
    local_1b8._reader.pointers = decl._reader.pointers;
    local_1b8._reader.segment = decl._reader.segment;
    local_1b8._reader.capTable = decl._reader.capTable;
    __return_storage_ptr__ = &local_c0;
    local_1b8._reader._32_8_ = uVar1;
    Declaration::Field::Reader::getType((Reader *)__return_storage_ptr__,(Reader *)&local_1b8);
    break;
  case 9:
    local_188._reader.nestingLimit = decl._reader.nestingLimit;
    local_188._reader._44_4_ = decl._reader._44_4_;
    local_188._reader.data = decl._reader.data;
    local_188._reader.pointers = decl._reader.pointers;
    local_188._reader.segment = decl._reader.segment;
    local_188._reader.capTable = decl._reader.capTable;
    local_188._reader._32_8_ = uVar1;
    Declaration::Interface::Reader::getSuperclasses((Reader *)&local_1b8,(Reader *)&local_188);
    uVar2 = (uint)local_1b8._reader.pointers;
    local_1c8.container = (Reader *)&local_1b8;
    for (local_1c8.index = 0; local_1c8.index != uVar2; local_1c8.index = local_1c8.index + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
      ::operator*((Reader *)&local_188,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                   *)&local_1c8);
      exp_00._reader.capTable = local_188._reader.capTable;
      exp_00._reader.segment = local_188._reader.segment;
      exp_00._reader.data = local_188._reader.data;
      exp_00._reader.pointers = local_188._reader.pointers;
      exp_00._reader.dataSize = local_188._reader.dataSize;
      exp_00._reader.pointerCount = local_188._reader.pointerCount;
      exp_00._reader._38_2_ = local_188._reader._38_2_;
      exp_00._reader.nestingLimit = local_188._reader.nestingLimit;
      exp_00._reader._44_4_ = local_188._reader._44_4_;
      findImports(exp_00,output);
    }
    goto switchD_001175f1_caseD_3;
  case 10:
    local_1b8._reader.nestingLimit = decl._reader.nestingLimit;
    local_1b8._reader._44_4_ = decl._reader._44_4_;
    local_1b8._reader.data = decl._reader.data;
    local_1b8._reader.pointers = decl._reader.pointers;
    local_1b8._reader.segment = decl._reader.segment;
    local_1b8._reader.capTable = decl._reader.capTable;
    local_1b8._reader._32_8_ = uVar1;
    Declaration::Method::Reader::getParams(&local_f0,(Reader *)&local_1b8);
    paramList._reader.capTable = local_f0._reader.capTable;
    paramList._reader.segment = local_f0._reader.segment;
    paramList._reader.data = local_f0._reader.data;
    paramList._reader.pointers = local_f0._reader.pointers;
    paramList._reader.dataSize = local_f0._reader.dataSize;
    paramList._reader.pointerCount = local_f0._reader.pointerCount;
    paramList._reader._38_2_ = local_f0._reader._38_2_;
    paramList._reader.nestingLimit = local_f0._reader.nestingLimit;
    paramList._reader._44_4_ = local_f0._reader._44_4_;
    findImports(paramList,output);
    if ((0x6f < local_1b8._reader.dataSize) && (*(short *)((long)local_1b8._reader.data + 0xc) == 1)
       ) {
      local_188._reader.dataSize = local_1b8._reader.dataSize;
      local_188._reader.pointerCount = local_1b8._reader.pointerCount;
      local_188._reader._38_2_ = local_1b8._reader._38_2_;
      local_188._reader.nestingLimit = local_1b8._reader.nestingLimit;
      local_188._reader._44_4_ = local_1b8._reader._44_4_;
      local_188._reader.data = local_1b8._reader.data;
      local_188._reader.pointers = local_1b8._reader.pointers;
      local_188._reader.segment = local_1b8._reader.segment;
      local_188._reader.capTable = local_1b8._reader.capTable;
      Declaration::Method::Results::Reader::getExplicit(&local_120,(Reader *)&local_188);
      paramList_00._reader.capTable = local_120._reader.capTable;
      paramList_00._reader.segment = local_120._reader.segment;
      paramList_00._reader.data = local_120._reader.data;
      paramList_00._reader.pointers = local_120._reader.pointers;
      paramList_00._reader.dataSize = local_120._reader.dataSize;
      paramList_00._reader.pointerCount = local_120._reader.pointerCount;
      paramList_00._reader._38_2_ = local_120._reader._38_2_;
      paramList_00._reader.nestingLimit = local_120._reader.nestingLimit;
      paramList_00._reader._44_4_ = local_120._reader._44_4_;
      findImports(paramList_00,output);
    }
    goto switchD_001175f1_caseD_3;
  }
  findImports((Reader)*__return_storage_ptr__,output);
switchD_001175f1_caseD_3:
  Declaration::Reader::getAnnotations((Reader *)&local_1b8,&decl);
  uVar2 = (uint)local_1b8._reader.pointers;
  local_1c8.container = (Reader *)&local_1b8;
  for (local_1c8.index = 0; local_1c8.index != uVar2; local_1c8.index = local_1c8.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
    ::operator*(&local_188,&local_1c8);
    Declaration::AnnotationApplication::Reader::getName(&local_150,&local_188);
    exp._reader.capTable = local_150._reader.capTable;
    exp._reader.segment = local_150._reader.segment;
    exp._reader.data = local_150._reader.data;
    exp._reader.pointers = local_150._reader.pointers;
    exp._reader.dataSize = local_150._reader.dataSize;
    exp._reader.pointerCount = local_150._reader.pointerCount;
    exp._reader._38_2_ = local_150._reader._38_2_;
    exp._reader.nestingLimit = local_150._reader.nestingLimit;
    exp._reader._44_4_ = local_150._reader._44_4_;
    findImports(exp,output);
  }
  Declaration::Reader::getNestedDecls((Reader *)&local_1b8,&decl);
  uVar2 = (uint)local_1b8._reader.pointers;
  local_1c8.container = (Reader *)&local_1b8;
  for (local_1c8.index = 0; local_1c8.index != uVar2; local_1c8.index = local_1c8.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*((Reader *)&local_188,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 *)&local_1c8);
    decl_00._reader.capTable = local_188._reader.capTable;
    decl_00._reader.segment = local_188._reader.segment;
    decl_00._reader.data = local_188._reader.data;
    decl_00._reader.pointers = local_188._reader.pointers;
    decl_00._reader.dataSize = local_188._reader.dataSize;
    decl_00._reader.pointerCount = local_188._reader.pointerCount;
    decl_00._reader._38_2_ = local_188._reader._38_2_;
    decl_00._reader.nestingLimit = local_188._reader.nestingLimit;
    decl_00._reader._44_4_ = local_188._reader._44_4_;
    findImports(decl_00,output);
  }
  return;
}

Assistant:

static void findImports(Declaration::Reader decl, std::set<kj::StringPtr>& output) {
  switch (decl.which()) {
    case Declaration::USING:
      findImports(decl.getUsing().getTarget(), output);
      break;
    case Declaration::CONST:
      findImports(decl.getConst().getType(), output);
      break;
    case Declaration::FIELD:
      findImports(decl.getField().getType(), output);
      break;
    case Declaration::INTERFACE:
      for (auto superclass: decl.getInterface().getSuperclasses()) {
        findImports(superclass, output);
      }
      break;
    case Declaration::METHOD: {
      auto method = decl.getMethod();

      findImports(method.getParams(), output);
      if (method.getResults().isExplicit()) {
        findImports(method.getResults().getExplicit(), output);
      }
      break;
    }
    default:
      break;
  }

  for (auto ann: decl.getAnnotations()) {
    findImports(ann.getName(), output);
  }

  for (auto nested: decl.getNestedDecls()) {
    findImports(nested, output);
  }
}